

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnDataSegmentInitExpr_GlobalGet
          (SharedValidator *this,Location *loc,Var *global_var)

{
  Type local_90;
  Type local_8c;
  Enum local_88;
  Enum local_84;
  Var local_80;
  Enum local_34;
  GlobalType local_30;
  GlobalType ref_global;
  Var *global_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  ref_global = (GlobalType)global_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  GlobalType::GlobalType(&local_30);
  Var::Var(&local_80,global_var);
  local_34 = (Enum)CheckGlobalIndex(this,&local_80,&local_30);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_34);
  Var::~Var(&local_80);
  if ((local_30.mutable_ & 1U) != 0) {
    local_84 = (Enum)PrintError(this,loc,"initializer expression cannot reference a mutable global")
    ;
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_84);
  }
  local_8c.enum_ = local_30.type.enum_;
  Type::Type(&local_90,I32);
  local_88 = (Enum)CheckType(this,loc,local_8c,local_90,"data segment offset");
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_88);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnDataSegmentInitExpr_GlobalGet(const Location& loc,
                                                        Var global_var) {
  Result result = Result::Ok;
  GlobalType ref_global;
  result |= CheckGlobalIndex(global_var, &ref_global);

  if (ref_global.mutable_) {
    result |= PrintError(
        loc, "initializer expression cannot reference a mutable global");
  }

  result |= CheckType(loc, ref_global.type, Type::I32, "data segment offset");
  return result;
}